

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

parser_error parse_player_timed_end_message(parser *p)

{
  parser_error pVar1;
  long *plVar2;
  char *s2;
  char *pcVar3;
  
  plVar2 = (long *)parser_priv(p);
  if (plVar2 != (long *)0x0) {
    if (*plVar2 == 0) {
      pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
    }
    else {
      pcVar3 = *(char **)(*plVar2 + 0x18);
      s2 = parser_getstr(p,"text");
      pcVar3 = string_append(pcVar3,s2);
      *(char **)(*plVar2 + 0x18) = pcVar3;
      pVar1 = PARSE_ERROR_NONE;
    }
    return pVar1;
  }
  __assert_fail("ps",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                ,0x83,"enum parser_error parse_player_timed_end_message(struct parser *)");
}

Assistant:

static enum parser_error parse_player_timed_end_message(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	ps->t->on_end = string_append(ps->t->on_end, parser_getstr(p, "text"));
	return PARSE_ERROR_NONE;
}